

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O2

wchar_t validate_time_flag(archive *_a,wchar_t flag,char *_fn)

{
  int iVar1;
  wchar_t wVar2;
  char *fmt;
  
  iVar1 = __archive_check_magic(_a,0xcad11c9,1,_fn);
  if (iVar1 == -0x1e) {
    wVar2 = L'\xffffffe2';
  }
  else {
    if ((flag & 0xfc00U) == 0) {
      if ((flag & 0x300U) == 0) {
        fmt = "No time flag";
      }
      else if ((flag & 0xecU) == 0) {
        if ((flag & 0x13U) != 0) {
          return L'\0';
        }
        fmt = "No comparison flag";
      }
      else {
        fmt = "Invalid comparison flag";
      }
    }
    else {
      fmt = "Invalid time flag";
    }
    archive_set_error(_a,0x16,fmt);
    wVar2 = L'\xffffffe7';
  }
  return wVar2;
}

Assistant:

static int
validate_time_flag(struct archive *_a, int flag, const char *_fn)
{
	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, _fn);

	/* Check a type of time. */
	if (flag &
	   ((~(ARCHIVE_MATCH_MTIME | ARCHIVE_MATCH_CTIME)) & 0xff00)) {
		archive_set_error(_a, EINVAL, "Invalid time flag");
		return (ARCHIVE_FAILED);
	}
	if ((flag & (ARCHIVE_MATCH_MTIME | ARCHIVE_MATCH_CTIME)) == 0) {
		archive_set_error(_a, EINVAL, "No time flag");
		return (ARCHIVE_FAILED);
	}

	/* Check a type of comparison. */
	if (flag &
	   ((~(ARCHIVE_MATCH_NEWER | ARCHIVE_MATCH_OLDER
			| ARCHIVE_MATCH_EQUAL)) & 0x00ff)) {
		archive_set_error(_a, EINVAL, "Invalid comparison flag");
		return (ARCHIVE_FAILED);
	}
	if ((flag & (ARCHIVE_MATCH_NEWER | ARCHIVE_MATCH_OLDER
	    | ARCHIVE_MATCH_EQUAL)) == 0) {
		archive_set_error(_a, EINVAL, "No comparison flag");
		return (ARCHIVE_FAILED);
	}

	return (ARCHIVE_OK);
}